

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O0

void __thiscall lzham::prefix_coding::decoder_tables::clear(decoder_tables *this)

{
  uint *in_RDI;
  
  if (*(long *)(in_RDI + 0x2a) != 0) {
    lzham_delete_array<unsigned_int>(in_RDI);
    in_RDI[0x2a] = 0;
    in_RDI[0x2b] = 0;
    in_RDI[0x29] = 0;
  }
  if (*(long *)(in_RDI + 0x2e) != 0) {
    lzham_delete_array<unsigned_short>((unsigned_short *)in_RDI);
    in_RDI[0x2e] = 0;
    in_RDI[0x2f] = 0;
    in_RDI[0x2c] = 0;
  }
  return;
}

Assistant:

inline void clear()
         {
            if (m_lookup)
            {
               lzham_delete_array(m_lookup);
               m_lookup = 0;
               m_cur_lookup_size = 0;
            }

            if (m_sorted_symbol_order)
            {
               lzham_delete_array(m_sorted_symbol_order);
               m_sorted_symbol_order = NULL;
               m_cur_sorted_symbol_order_size = 0;
            }
         }